

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O0

int count_tests(TestSuite *suite)

{
  int iVar1;
  long in_RDI;
  int i;
  int count;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  for (iVar2 = 0; iVar2 < *(int *)(in_RDI + 0x30); iVar2 = iVar2 + 1) {
    if (*(int *)(*(long *)(in_RDI + 0x18) + (long)iVar2 * 0x18) == 0) {
      iVar3 = iVar3 + 1;
    }
    else {
      iVar1 = count_tests((TestSuite *)CONCAT44(iVar3,iVar2));
      iVar3 = iVar1 + iVar3;
    }
  }
  return iVar3;
}

Assistant:

int count_tests(TestSuite *suite) {
    int count = 0;
    int i;
    for (i = 0; i < suite->size; i++) {
        if (suite->tests[i].type == test_function) {
            count++;
        } else {
            count += count_tests(suite->tests[i].Runnable.suite);
        }
    }
    return count;
}